

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.h
# Opt level: O2

void __thiscall
Js::JavascriptExceptionObject::JavascriptExceptionObject
          (JavascriptExceptionObject *this,Var object,ScriptContext *scriptContext,
          JavascriptExceptionContext *exceptionContextIn,bool isPendingExceptionObject)

{
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->thrownObject,object);
  Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierSet(&this->scriptContext,scriptContext);
  this->byteCodeOffsetAfterDebuggerSkip = -1;
  this->field_0x14 = (isPendingExceptionObject * '\x02' | this->field_0x14 & 0x80) + 1;
  (this->exceptionContext).m_throwingFunctionByteCodeOffset = 0;
  this->hostWrapperCreateFunc = (Type)0x0;
  (this->exceptionContext).m_throwingFunction.ptr = (JavascriptFunction *)0x0;
  (this->exceptionContext).m_stackTrace.ptr =
       (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->exceptionContext).m_originalStackTrace.ptr =
       (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->stackBackTrace).ptr = (StackBackTrace *)0x0;
  (this->next).ptr = (JavascriptExceptionObject *)0x0;
  if (exceptionContextIn == (JavascriptExceptionContext *)0x0) {
    (this->exceptionContext).m_stackTrace.ptr =
         (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    (this->exceptionContext).m_originalStackTrace.ptr =
         (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    (this->exceptionContext).m_throwingFunction.ptr = (JavascriptFunction *)0x0;
    *(undefined8 *)&(this->exceptionContext).m_throwingFunctionByteCodeOffset = 0;
  }
  else {
    JavascriptExceptionContext::operator=(&this->exceptionContext,exceptionContextIn);
  }
  (this->stackBackTrace).ptr = (StackBackTrace *)0x0;
  return;
}

Assistant:

JavascriptExceptionObject(Var object, ScriptContext * scriptContext, JavascriptExceptionContext* exceptionContextIn, bool isPendingExceptionObject = false) :
            thrownObject(object),
            isPendingExceptionObject(isPendingExceptionObject),
            scriptContext(scriptContext), tag(true),
#ifdef ENABLE_SCRIPT_DEBUGGING
            isDebuggerSkip(false), byteCodeOffsetAfterDebuggerSkip(Constants::InvalidByteCodeOffset), hasDebuggerLogged(false),
            isFirstChance(false), isExceptionCaughtInNonUserCode(false), ignoreAdvanceToNextStatement(false),
#endif
            hostWrapperCreateFunc(nullptr),
            next(nullptr)
        {
            if (exceptionContextIn)
            {
                exceptionContext = *exceptionContextIn;
            }
            else
            {
                memset(&exceptionContext, 0, sizeof(exceptionContext));
            }
#if ENABLE_DEBUG_STACK_BACK_TRACE
            this->stackBackTrace = nullptr;
#endif
        }